

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_SetDefaultParams(Cbs2_Par_t *pPars)

{
  Cbs2_Par_t *pPars_local;
  
  memset(pPars,0,0x30);
  pPars->nBTLimit = 1000;
  pPars->nJustLimit = 500;
  pPars->fUseHighest = 1;
  pPars->fUseLowest = 0;
  pPars->fUseMaxFF = 0;
  pPars->fUseFanout = 1;
  pPars->fVerbose = 1;
  return;
}

Assistant:

void Cbs2_SetDefaultParams( Cbs2_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Cbs2_Par_t) );
    pPars->nBTLimit    =  1000;   // limit on the number of conflicts
    pPars->nJustLimit  =   500;   // limit on the size of justification queue
    pPars->fUseHighest =     1;   // use node with the highest ID
    pPars->fUseLowest  =     0;   // use node with the highest ID
    pPars->fUseMaxFF   =     0;   // use node with the largest fanin fanout
    pPars->fUseFanout  =     1;
    pPars->fVerbose    =     1;   // print detailed statistics
}